

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O3

void strpool_discard(strpool_t *pool,unsigned_long_long handle)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  strpool_internal_handle_t *psVar5;
  strpool_internal_block_t *psVar6;
  int *piVar7;
  int *piVar8;
  strpool_internal_hash_slot_t *psVar9;
  strpool_internal_entry_t *psVar10;
  char *pcVar11;
  undefined8 uVar12;
  strpool_internal_entry_t *psVar13;
  uint uVar14;
  uint uVar15;
  strpool_internal_entry_t *psVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  strpool_internal_free_block_t *new_entry;
  long lVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  
  psVar16 = strpool_internal_get_entry(pool,handle);
  if (psVar16 == (strpool_internal_entry_t *)0x0) {
    return;
  }
  if (psVar16->refcount != 0) {
    return;
  }
  psVar5 = pool->handles;
  iVar1 = psVar16->handle_index;
  iVar2 = psVar5[iVar1].entry_index;
  if (0 < (long)pool->block_count) {
    psVar6 = pool->blocks;
    piVar7 = (int *)psVar16->data;
    lVar20 = 0;
    do {
      piVar8 = *(int **)((long)&psVar6->data + lVar20);
      if ((piVar8 <= piVar7) && (piVar7 <= *(int **)((long)&psVar6->tail + lVar20))) {
        uVar22 = *(uint *)((long)&psVar6->free_list + lVar20);
        lVar23 = (long)(int)uVar22;
        iVar19 = (int)piVar7;
        iVar21 = (int)piVar8;
        if (-1 < lVar23) {
          iVar18 = psVar16->size;
          iVar3 = *(int *)((long)piVar8 + lVar23);
          uVar4 = uVar22;
          uVar15 = 0xffffffff;
          goto joined_r0x001082f7;
        }
        *(int *)((long)&psVar6->free_list + lVar20) = iVar19 - iVar21;
        piVar7[1] = -1;
        iVar18 = psVar16->size;
        goto LAB_0010835b;
      }
      lVar20 = lVar20 + 0x20;
    } while ((long)pool->block_count * 0x20 != lVar20);
  }
LAB_0010835e:
  if ((long)pool->handle_freelist_tail < 0) {
    if (-1 < pool->handle_freelist_head) {
      __assert_fail("pool->handle_freelist_head < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                    ,0x459,"void strpool_discard(strpool_t *, unsigned long long)");
    }
    pool->handle_freelist_head = iVar1;
  }
  else {
    psVar5[pool->handle_freelist_tail].entry_index = iVar1;
  }
  pool->handle_freelist_tail = iVar1;
  psVar5[iVar1].counter = psVar5[iVar1].counter + 1;
  psVar5[iVar1].entry_index = -1;
  psVar9 = pool->hash_table;
  iVar1 = psVar16->hash_slot;
  if ((long)(int)psVar9[iVar1].hash_key == 0) {
    __assert_fail("hash",
                  "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                  ,0x468,"void strpool_discard(strpool_t *, unsigned long long)");
  }
  psVar9[(long)pool->hash_capacity - 1U & (long)(int)psVar9[iVar1].hash_key].base_count =
       psVar9[(long)pool->hash_capacity - 1U & (long)(int)psVar9[iVar1].hash_key].base_count + -1;
  psVar9[iVar1].hash_key = 0;
  uVar17 = (long)pool->entry_count - 1;
  if (iVar2 != (int)uVar17) {
    psVar10 = pool->entries;
    psVar16 = psVar10 + uVar17;
    iVar19 = psVar16->hash_slot;
    iVar21 = psVar16->handle_index;
    pcVar11 = psVar16->data;
    psVar16 = psVar10 + uVar17;
    iVar1 = psVar16->length;
    uVar12 = *(undefined8 *)(&psVar16->size + 2);
    psVar13 = psVar10 + iVar2;
    psVar13->size = psVar16->size;
    psVar13->length = iVar1;
    *(undefined8 *)(&psVar13->size + 2) = uVar12;
    psVar10 = psVar10 + iVar2;
    psVar10->hash_slot = iVar19;
    psVar10->handle_index = iVar21;
    psVar10->data = pcVar11;
    psVar16 = pool->entries;
    pool->hash_table[psVar16[iVar2].hash_slot].entry_index = iVar2;
    pool->handles[psVar16[iVar2].handle_index].entry_index = iVar2;
    uVar17 = (ulong)(pool->entry_count - 1);
  }
  pool->entry_count = (int)uVar17;
  return;
joined_r0x001082f7:
  uVar14 = uVar4;
  if (iVar3 <= iVar18) goto LAB_00108332;
  uVar4 = *(uint *)((long)piVar8 + lVar23 + 4);
  lVar23 = (long)(int)uVar4;
  if (lVar23 < 0) goto LAB_0010835e;
  iVar3 = *(int *)((long)piVar8 + lVar23);
  uVar15 = uVar14;
  goto joined_r0x001082f7;
LAB_00108332:
  if ((int)uVar15 < 0) {
    *(int *)((long)&psVar6->free_list + lVar20) = iVar19 - iVar21;
  }
  else {
    *(int *)((long)piVar8 + (ulong)uVar15 + 4) = iVar19 - iVar21;
    uVar22 = *(uint *)((long)piVar8 + lVar23 + 4);
  }
  piVar7[1] = uVar22;
LAB_0010835b:
  *piVar7 = iVar18;
  goto LAB_0010835e;
}

Assistant:

void strpool_discard( strpool_t* pool, STRPOOL_U64 handle )
    {   
    strpool_internal_entry_t* entry = strpool_internal_get_entry( pool, handle );
    if( entry && entry->refcount == 0 )
        {
        int entry_index = pool->handles[ entry->handle_index ].entry_index;

        // recycle string mem
        for( int i = 0; i < pool->block_count; ++i )
            {
            strpool_internal_block_t* block = &pool->blocks[ i ];
            if( entry->data >= block->data && entry->data <= block->tail )
                {
                if( block->free_list < 0 )
                    {
                    strpool_internal_free_block_t* new_entry = (strpool_internal_free_block_t*) ( entry->data );
                    block->free_list = (int) ( entry->data - block->data );
                    new_entry->next = -1;
                    new_entry->size = entry->size;
                    }
                else
                    {
                    int free_list = block->free_list;
                    int prev_list = -1;
                    while( free_list >= 0 )
                        {
                        strpool_internal_free_block_t* free_entry = 
                            (strpool_internal_free_block_t*) ( pool->blocks[ i ].data + free_list );
                        if( free_entry->size <= entry->size ) 
                            {
                            strpool_internal_free_block_t* new_entry = (strpool_internal_free_block_t*) ( entry->data );
                            if( prev_list < 0 )
                                {
                                new_entry->next = pool->blocks[ i ].free_list;
                                pool->blocks[ i ].free_list = (int) ( entry->data - block->data );          
                                }
                            else
                                {
                                strpool_internal_free_block_t* prev_entry = 
                                    (strpool_internal_free_block_t*) ( pool->blocks[ i ].data + prev_list );
                                prev_entry->next = (int) ( entry->data - block->data );
                                new_entry->next = free_entry->next;
                                }
                            new_entry->size = entry->size;
                            break;
                            }
                        prev_list = free_list;
                        free_list = free_entry->next;
                        }
                    }
                break;
                }
            }

        // recycle handle
        if( pool->handle_freelist_tail < 0 )
            {
            STRPOOL_ASSERT( pool->handle_freelist_head < 0 );
            pool->handle_freelist_head = entry->handle_index;
            pool->handle_freelist_tail = entry->handle_index;
            }
        else
            {
            pool->handles[ pool->handle_freelist_tail ].entry_index = entry->handle_index;
            pool->handle_freelist_tail = entry->handle_index;
            }
        ++pool->handles[ entry->handle_index ].counter; // invalidate handle via counter
        pool->handles[ entry->handle_index ].entry_index = -1;

        // recycle hash slot
        STRPOOL_U32 hash = pool->hash_table[ entry->hash_slot ].hash_key;
        int base_slot = (int)( hash & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
        STRPOOL_ASSERT( hash );
        --pool->hash_table[ base_slot ].base_count;
        pool->hash_table[ entry->hash_slot ].hash_key = 0;

        // recycle entry
        if( entry_index != pool->entry_count - 1 )
            {
            pool->entries[ entry_index ] = pool->entries[ pool->entry_count - 1 ];
            pool->hash_table[ pool->entries[ entry_index ].hash_slot ].entry_index = entry_index;
            pool->handles[ pool->entries[ entry_index ].handle_index ].entry_index = entry_index;
            }
        --pool->entry_count;
        }       

    }